

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall amrex::AmrLevel::removeOldData(AmrLevel *this)

{
  pointer pSVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = DescriptorList::size((DescriptorList *)desc_lst);
  if (0 < iVar3) {
    lVar5 = 0xd0;
    lVar4 = 0;
    do {
      pSVar1 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar2 = *(long **)((long)&(pSVar1->domain).smallend + lVar5 + -0x10);
      *(undefined8 *)((long)&(pSVar1->domain).smallend + lVar5 + -0x10) = 0;
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
      lVar4 = lVar4 + 1;
      iVar3 = DescriptorList::size((DescriptorList *)desc_lst);
      lVar5 = lVar5 + 0xe0;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

void
AmrLevel::removeOldData ()
{
    for (int i = 0; i < desc_lst.size(); i++)
    {
        state[i].removeOldData();
    }
}